

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# png_image.c
# Opt level: O3

_Bool save_png_image_to_file(FILE *fp,image *image)

{
  float fVar1;
  ulong uVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  char cVar7;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  undefined6 uVar15;
  undefined8 uVar16;
  unkbyte10 Var17;
  undefined1 auVar18 [12];
  undefined1 auVar19 [14];
  short sVar20;
  undefined4 uVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  undefined1 auVar25 [16];
  void *__ptr;
  int iVar26;
  png_structp ppVar27;
  __jmp_buf_tag *__env;
  size_t sVar28;
  size_t sVar29;
  undefined1 *puVar30;
  void *pvVar31;
  long lVar32;
  size_t sVar33;
  undefined1 *puVar34;
  size_t sVar35;
  undefined1 uVar36;
  undefined1 uVar37;
  undefined1 uVar38;
  undefined1 uVar39;
  char cVar40;
  char cVar41;
  char cVar42;
  float fVar43;
  float fVar44;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  png_structp png_ptr;
  png_infop info_ptr;
  void *local_50;
  size_t local_48;
  void *local_40;
  long local_38;
  char cVar8;
  char cVar9;
  char cVar10;
  
  if (1 < image->channel_count - 3) {
    __assert_fail("is_rgb_or_rgba_image(image)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/madmann91[P]rt/src/io/png_image.c"
                  ,0x74,"_Bool save_png_image_to_file(FILE *, const struct image *)");
  }
  ppVar27 = (png_structp)png_create_write_struct("1.6.37",0,0);
  if (ppVar27 == (png_structp)0x0) {
    return false;
  }
  png_ptr = ppVar27;
  info_ptr = (png_infop)png_create_info_struct(ppVar27);
  if (info_ptr == (png_infop)0x0) {
    png_destroy_read_struct(&png_ptr,0);
    return false;
  }
  __env = (__jmp_buf_tag *)png_set_longjmp_fn(ppVar27,longjmp,200);
  iVar26 = _setjmp(__env);
  if (iVar26 != 0) {
    png_destroy_write_struct(&png_ptr,&info_ptr);
    return false;
  }
  png_init_io(png_ptr,fp);
  png_set_IHDR(png_ptr,info_ptr,(int)image->width,(int)image->height,8,
               (image->channel_count != 3) * '\x04' + '\x02',0,0,0);
  png_write_info(png_ptr,info_ptr);
  uVar2 = image->channel_count;
  sVar3 = image->width;
  local_48 = image->height;
  local_40 = (void *)0x0;
  if ((local_48 * 8 != 0) && (local_40 = malloc(local_48 * 8), local_40 == (void *)0x0)) {
    save_png_image_to_file_cold_1();
    local_40 = (void *)0x0;
  }
  lVar32 = sVar3 * uVar2;
  if (lVar32 * local_48 != 0) {
    local_50 = malloc(lVar32 * local_48);
    if (local_50 != (void *)0x0) goto LAB_00107abe;
    save_png_image_to_file_cold_2();
  }
  local_50 = (void *)0x0;
LAB_00107abe:
  __ptr = local_40;
  auVar25 = _DAT_0010cab0;
  if (local_48 != 0) {
    puVar34 = (undefined1 *)((long)local_50 + 2);
    local_38 = sVar3 * 4;
    sVar33 = 0;
    pvVar31 = local_50;
    sVar29 = sVar33;
    do {
      *(void **)((long)local_40 + sVar29 * 8) = (void *)(sVar29 * lVar32 + (long)local_50);
      if (uVar2 < 4) {
        if (sVar3 != 0) {
          if (uVar2 != 3) {
            __assert_fail("x < image->width && y < image->height && image->channel_count >= 3",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/madmann91[P]rt/src/scene/image.h"
                          ,0x3e,"struct rgb get_rgb_pixel(const struct image *, size_t, size_t)");
          }
          sVar4 = image[1].channel_count;
          sVar5 = image[1].height;
          sVar6 = image[1].width;
          sVar28 = 0;
          puVar30 = puVar34;
          do {
            fVar1 = *(float *)(sVar6 + sVar33 + sVar28 * 4);
            uVar36 = SUB41(fVar1,0);
            uVar37 = (undefined1)((uint)fVar1 >> 8);
            uVar38 = (undefined1)((uint)fVar1 >> 0x10);
            uVar39 = (undefined1)((uint)fVar1 >> 0x18);
            fVar43 = *(float *)(sVar5 + sVar33 + sVar28 * 4);
            fVar44 = *(float *)(sVar4 + sVar33 + sVar28 * 4);
            if (fVar1 <= 0.0) {
              uVar36 = 0;
              uVar37 = 0;
              uVar38 = 0;
              uVar39 = 0;
            }
            if (1.0 <= (float)CONCAT13(uVar39,CONCAT12(uVar38,CONCAT11(uVar37,uVar36)))) {
              uVar36 = 0;
              uVar37 = 0;
              uVar38 = 0x80;
              uVar39 = 0x3f;
            }
            if (fVar43 <= 0.0) {
              fVar43 = 0.0;
            }
            if (1.0 <= fVar43) {
              fVar43 = 1.0;
            }
            puVar30[-2] = (char)(int)((float)CONCAT13(uVar39,CONCAT12(uVar38,CONCAT11(uVar37,uVar36)
                                                                     )) * 255.0);
            puVar30[-1] = (char)(int)(fVar43 * 255.0);
            if (fVar44 <= 0.0) {
              fVar44 = 0.0;
            }
            if (1.0 <= fVar44) {
              fVar44 = 1.0;
            }
            *puVar30 = (char)(int)(fVar44 * 255.0);
            sVar28 = sVar28 + 1;
            puVar30 = puVar30 + 3;
          } while (sVar3 != sVar28);
        }
      }
      else if (sVar3 != 0) {
        sVar4 = image[2].width;
        sVar5 = image[1].channel_count;
        sVar6 = image[1].height;
        sVar28 = image[1].width;
        sVar35 = 0;
        do {
          auVar45._4_4_ = *(undefined4 *)(sVar6 + sVar33 + sVar35 * 4);
          auVar45._0_4_ = *(undefined4 *)(sVar28 + sVar33 + sVar35 * 4);
          auVar45._12_4_ = *(undefined4 *)(sVar4 + sVar33 + sVar35 * 4);
          auVar45._8_4_ = *(undefined4 *)(sVar5 + sVar33 + sVar35 * 4);
          auVar46 = maxps(auVar45,ZEXT816(0));
          auVar46 = minps(auVar46,auVar25);
          iVar26 = (int)(auVar46._0_4_ * 255.0);
          iVar22 = (int)(auVar46._4_4_ * 255.0);
          cVar40 = (char)((uint)iVar22 >> 0x10);
          iVar23 = (int)(auVar46._8_4_ * 255.0);
          cVar41 = (char)((uint)iVar23 >> 0x10);
          iVar24 = (int)(auVar46._12_4_ * 255.0);
          cVar42 = (char)((uint)iVar24 >> 0x10);
          uVar15 = CONCAT15((char)((uint)iVar22 >> 8),CONCAT14((char)iVar22,iVar26));
          uVar16 = CONCAT17((char)((uint)iVar22 >> 0x18),CONCAT16(cVar40,uVar15));
          Var17 = CONCAT19((char)((uint)iVar23 >> 8),CONCAT18((char)iVar23,uVar16));
          auVar18[10] = cVar41;
          auVar18._0_10_ = Var17;
          auVar18[0xb] = (char)((uint)iVar23 >> 0x18);
          auVar19[0xc] = (char)iVar24;
          auVar19._0_12_ = auVar18;
          auVar19[0xd] = (char)((uint)iVar24 >> 8);
          auVar46[0xe] = cVar42;
          auVar46._0_14_ = auVar19;
          auVar46[0xf] = (char)((uint)iVar24 >> 0x18);
          sVar11 = (short)iVar26;
          cVar7 = (0 < sVar11) * (sVar11 < 0x100) * (char)iVar26 - (0xff < sVar11);
          sVar11 = (short)((uint)iVar26 >> 0x10);
          sVar12 = (short)((uint6)uVar15 >> 0x20);
          cVar8 = (0 < sVar12) * (sVar12 < 0x100) * (char)iVar22 - (0xff < sVar12);
          sVar12 = (short)((ulong)uVar16 >> 0x30);
          sVar13 = (short)((unkuint10)Var17 >> 0x40);
          cVar9 = (0 < sVar13) * (sVar13 < 0x100) * (char)iVar23 - (0xff < sVar13);
          sVar13 = auVar18._10_2_;
          sVar14 = auVar19._12_2_;
          cVar10 = (0 < sVar14) * (sVar14 < 0x100) * (char)iVar24 - (0xff < sVar14);
          sVar14 = auVar46._14_2_;
          sVar20 = CONCAT11((0 < sVar11) * (sVar11 < 0x100) * (char)((uint)iVar26 >> 0x10) -
                            (0xff < sVar11),cVar7);
          uVar21 = CONCAT13((0 < sVar12) * (sVar12 < 0x100) * cVar40 - (0xff < sVar12),
                            CONCAT12(cVar8,sVar20));
          uVar15 = CONCAT15((0 < sVar13) * (sVar13 < 0x100) * cVar41 - (0xff < sVar13),
                            CONCAT14(cVar9,uVar21));
          sVar11 = (short)((uint)uVar21 >> 0x10);
          sVar12 = (short)((uint6)uVar15 >> 0x20);
          sVar13 = (short)(CONCAT17((0 < sVar14) * (sVar14 < 0x100) * cVar42 - (0xff < sVar14),
                                    CONCAT16(cVar10,uVar15)) >> 0x30);
          *(uint *)((long)pvVar31 + sVar35 * 4) =
               CONCAT13((0 < sVar13) * (sVar13 < 0x100) * cVar10 - (0xff < sVar13),
                        CONCAT12((0 < sVar12) * (sVar12 < 0x100) * cVar9 - (0xff < sVar12),
                                 CONCAT11((0 < sVar11) * (sVar11 < 0x100) * cVar8 - (0xff < sVar11),
                                          (0 < sVar20) * (sVar20 < 0x100) * cVar7 - (0xff < sVar20))
                                ));
          sVar35 = sVar35 + 1;
        } while (sVar3 != sVar35);
      }
      sVar29 = sVar29 + 1;
      puVar34 = puVar34 + lVar32;
      sVar33 = sVar33 + local_38;
      pvVar31 = (void *)((long)pvVar31 + lVar32);
    } while (sVar29 != local_48);
  }
  png_write_image(png_ptr,local_40);
  free(__ptr);
  free(local_50);
  png_write_end(png_ptr,info_ptr);
  png_destroy_write_struct(&png_ptr,&info_ptr);
  return true;
}

Assistant:

static bool save_png_image_to_file(FILE* fp, const struct image* image) {
    assert(is_rgb_or_rgba_image(image));

    png_structp png_ptr = png_create_write_struct(PNG_LIBPNG_VER_STRING, NULL, NULL, NULL);
    if (!png_ptr)
        return false;

    png_infop info_ptr = png_create_info_struct(png_ptr);
    if (!info_ptr) {
        png_destroy_read_struct(&png_ptr, NULL, NULL);
        return false;
    }

    png_byte** row_ptrs = NULL;
    png_byte* row_bytes = NULL;
    if (setjmp(png_jmpbuf(png_ptr))) {
        if (row_ptrs)  free(row_ptrs);
        if (row_bytes) free(row_bytes);
        png_destroy_write_struct(&png_ptr, &info_ptr);
        return false;
    }

    png_init_io(png_ptr, fp);
    png_set_IHDR(
        png_ptr, info_ptr,
        image->width, image->height, 8,
        image->channel_count == 3 ? PNG_COLOR_TYPE_RGB : PNG_COLOR_TYPE_RGBA,
        PNG_INTERLACE_NONE, PNG_COMPRESSION_TYPE_BASE, PNG_FILTER_TYPE_BASE);
    png_write_info(png_ptr, info_ptr);

    bool has_alpha = image->channel_count >= 4;
    size_t stride = image->width * image->channel_count;
    row_ptrs  = xmalloc(sizeof(png_byte*) * image->height);
    row_bytes = xmalloc(sizeof(png_byte) * stride * image->height);
    for (size_t i = 0, n = image->height; i < n; ++i) {
        row_ptrs[i] = row_bytes + stride * i;
        png_byte* row = row_bytes + stride * i;
        if (has_alpha) {
            for (size_t j = 0, m = image->width; j < m; ++j) {
                struct rgba pixel = get_rgba_pixel(image, j, i);
                row[j * 4 + 0] = clamp_real(pixel.r, 0, 1) * (real_t)255;
                row[j * 4 + 1] = clamp_real(pixel.g, 0, 1) * (real_t)255;
                row[j * 4 + 2] = clamp_real(pixel.b, 0, 1) * (real_t)255;
                row[j * 4 + 3] = clamp_real(pixel.a, 0, 1) * (real_t)255;
            }
        } else {
            for (size_t j = 0, m = image->width; j < m; ++j) {
                struct rgb pixel = get_rgb_pixel(image, j, i);
                row[j * 3 + 0] = clamp_real(pixel.r, 0, 1) * (real_t)255;
                row[j * 3 + 1] = clamp_real(pixel.g, 0, 1) * (real_t)255;
                row[j * 3 + 2] = clamp_real(pixel.b, 0, 1) * (real_t)255;
            }
        }
    }
    png_write_image(png_ptr, row_ptrs);
    free(row_ptrs);
    free(row_bytes);
    row_ptrs = NULL;
    row_bytes = NULL;

    png_write_end(png_ptr, info_ptr);
    png_destroy_write_struct(&png_ptr, &info_ptr);
    return true;
}